

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

int mjs::interpreter::impl::tri_compare(double l,double r)

{
  uint uVar1;
  double r_local;
  double l_local;
  
  uVar1 = std::isnan(l);
  if (((uVar1 & 1) == 0) && (uVar1 = std::isnan(r), (uVar1 & 1) == 0)) {
    if (((l == r) && (!NAN(l) && !NAN(r))) ||
       ((((l == 0.0 && (!NAN(l))) && (r == 0.0)) && (!NAN(r))))) {
      l_local._4_4_ = 0;
    }
    else if ((l != INFINITY) || (NAN(l))) {
      if ((r != INFINITY) || (NAN(r))) {
        if ((r != -INFINITY) || (NAN(r))) {
          if ((l != -INFINITY) || (NAN(l))) {
            l_local._4_4_ = (uint)(l < r);
          }
          else {
            l_local._4_4_ = 1;
          }
        }
        else {
          l_local._4_4_ = 0;
        }
      }
      else {
        l_local._4_4_ = 1;
      }
    }
    else {
      l_local._4_4_ = 0;
    }
  }
  else {
    l_local._4_4_ = 0xffffffff;
  }
  return l_local._4_4_;
}

Assistant:

static int tri_compare(double l, double r) {
        if (std::isnan(l) || std::isnan(r)) {
            return -1;
        }
        if (l == r || (l == 0.0 && r == 0.0))  {
            return 0;
        }
        if (l == +INFINITY) {
            return 0;
        } else if (r == +INFINITY) {
            return 1;
        } else if (r == -INFINITY) {
            return 0;
        } else if (l == -INFINITY) {
            return 1;
        }
        return l < r;
    }